

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_data_edge.h
# Opt level: O0

bool absl::lts_20240722::cord_internal::IsDataEdge(CordRep *edge)

{
  CordRepSubstring *pCVar1;
  bool local_19;
  CordRep *local_18;
  CordRep *edge_local;
  
  if (edge != (CordRep *)0x0) {
    if ((edge->tag == '\x05') || (5 < edge->tag)) {
      edge_local._7_1_ = true;
    }
    else {
      local_18 = edge;
      if (edge->tag == '\x01') {
        pCVar1 = CordRep::substring(edge);
        local_18 = pCVar1->child;
      }
      local_19 = true;
      if (local_18->tag != '\x05') {
        local_19 = 5 < local_18->tag;
      }
      edge_local._7_1_ = local_19;
    }
    return edge_local._7_1_;
  }
  __assert_fail("edge != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_data_edge.h"
                ,0x21,"bool absl::cord_internal::IsDataEdge(const CordRep *)");
}

Assistant:

inline bool IsDataEdge(const CordRep* edge) {
  assert(edge != nullptr);

  // The fast path is that `edge` is an EXTERNAL or FLAT node, making the below
  // if a single, well predicted branch. We then repeat the FLAT or EXTERNAL
  // check in the slow path of the SUBSTRING check to optimize for the hot path.
  if (edge->tag == EXTERNAL || edge->tag >= FLAT) return true;
  if (edge->tag == SUBSTRING) edge = edge->substring()->child;
  return edge->tag == EXTERNAL || edge->tag >= FLAT;
}